

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

HTMLElement * __thiscall
soul::HTMLGenerator::createModuleSection(HTMLGenerator *this,HTMLElement *parent,string_view name)

{
  HTMLElement *this_00;
  HTMLElement *this_01;
  string_view className;
  allocator<char> local_41;
  string local_40;
  
  className._M_str = "module_section";
  className._M_len = 0xe;
  this_00 = choc::html::HTMLElement::addDiv(parent,className);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"h3",&local_41);
  this_01 = choc::html::HTMLElement::addChild(this_00,&local_40);
  choc::html::HTMLElement::addContent(this_01,name);
  std::__cxx11::string::~string((string *)&local_40);
  return this_00;
}

Assistant:

choc::html::HTMLElement& createModuleSection (choc::html::HTMLElement& parent, std::string_view name)
    {
        auto& list = parent.addDiv ("module_section");
        list.addChild ("h3").addContent (name);
        return list;
    }